

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.cpp
# Opt level: O1

bool rtf_ends_with(string *a,string *b)

{
  ulong __n;
  int iVar1;
  
  __n = b->_M_string_length;
  if (a->_M_string_length < __n) {
    return false;
  }
  if (__n != 0) {
    iVar1 = bcmp((a->_M_dataplus)._M_p + (a->_M_string_length - __n),(b->_M_dataplus)._M_p,__n);
    return iVar1 == 0;
  }
  return true;
}

Assistant:

bool rtf_ends_with(const string& a, const string& b)
{
    if (b.size() > a.size()) return false;
    return std::equal(a.begin() + a.size() - b.size(), a.end(), b.begin());
}